

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O2

TestLog * deqp::gles2::Functional::DepthStencilCaseUtil::operator<<
                    (TestLog *log,DepthStencilParams *params)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  char *pcVar3;
  MessageBuilder *this;
  char *pcVar4;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  
  poVar2 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Stencil test: ");
  pcVar4 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  pcVar3 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if (params->stencilTestEnabled != false) {
    pcVar3 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::operator<<((ostream *)poVar2,pcVar3 + 0x27);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  if (params->stencilTestEnabled == true) {
    poVar2 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Front-face stencil state: ");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    operator<<(log,params->stencil);
    poVar2 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Back-face stencil state: ");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    operator<<(log,params->stencil + 1);
  }
  poVar2 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Depth test: ");
  if (params->depthTestEnabled != false) {
    pcVar4 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::operator<<((ostream *)poVar2,pcVar4 + 0x27);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  if (params->depthTestEnabled == true) {
    poVar2 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"  func = ");
    local_1b8.m_value = params->depthFunc;
    local_1b8.m_getName = glu::getCompareFuncName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar2);
    std::operator<<((ostream *)poVar2,"\n  depth value = ");
    this = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a8,&params->depth);
    poVar1 = &this->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n  write mask = ")
    ;
    pcVar4 = "false";
    if (params->depthWriteMask != false) {
      pcVar4 = "true";
    }
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pcVar4);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
  }
  poVar2 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Triangles are ");
  pcVar4 = "back";
  if (params->visibleFace == FACETYPE_FRONT) {
    pcVar4 = "front";
  }
  std::operator<<((ostream *)poVar2,pcVar4);
  std::operator<<((ostream *)poVar2,"-facing");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const DepthStencilParams& params)
{
	log << TestLog::Message << "Stencil test: " << (params.stencilTestEnabled ? "enabled" : "disabled") << TestLog::EndMessage;
	if (params.stencilTestEnabled)
	{
		log << TestLog::Message << "Front-face stencil state: " << TestLog::EndMessage;
		log << params.stencil[rr::FACETYPE_FRONT];

		log << TestLog::Message << "Back-face stencil state: " << TestLog::EndMessage;
		log << params.stencil[rr::FACETYPE_BACK];
	}

	log << TestLog::Message << "Depth test: " << (params.depthTestEnabled ? "enabled" : "disabled") << TestLog::EndMessage;
	if (params.depthTestEnabled)
	{
		log << TestLog::Message << "  func = " << glu::getCompareFuncStr(params.depthFunc) << "\n"
								   "  depth value = " << params.depth << "\n"
								   "  write mask = " << (params.depthWriteMask ? "true" : "false") << "\n"
			<< TestLog::EndMessage;
	}

	log << TestLog::Message << "Triangles are " << (params.visibleFace == rr::FACETYPE_FRONT ? "front" : "back") << "-facing" << TestLog::EndMessage;

	return log;
}